

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode_bwe.c
# Opt level: O1

int WebRtcIsac_EstimateBandwidth
              (BwEstimatorstr *bwest_str,Bitstr *streamdata,size_t packet_size,
              uint16_t rtp_seq_number,uint32_t send_ts,uint32_t arr_ts,
              IsacSamplingRate encoderSampRate,IsacSamplingRate decoderSampRate)

{
  uint32_t uVar1;
  uint32_t uVar2;
  int16_t iVar3;
  int iVar4;
  undefined8 in_RAX;
  short sVar5;
  int16_t frame_samples;
  int16_t index;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  iVar4 = WebRtcIsac_DecodeFrameLen(streamdata,(int16_t *)((long)&uStack_38 + 4));
  if (-1 < iVar4) {
    iVar4 = WebRtcIsac_DecodeSendBW(streamdata,(int16_t *)((long)&uStack_38 + 6));
    if (-1 < iVar4) {
      iVar3 = WebRtcIsac_UpdateUplinkBwImpl(bwest_str,uStack_38._6_2_,encoderSampRate);
      if (iVar3 < 0) {
        iVar4 = (int)iVar3;
      }
      else {
        uVar1 = bwest_str->senderTimestamp;
        bwest_str->senderTimestamp = send_ts;
        uVar2 = bwest_str->receiverTimestamp;
        bwest_str->receiverTimestamp = arr_ts;
        sVar5 = uStack_38._4_2_ + 0xf;
        if (-1 < uStack_38._4_2_) {
          sVar5 = uStack_38._4_2_;
        }
        iVar3 = WebRtcIsac_UpdateBandwidthEstimator
                          (bwest_str,rtp_seq_number,(int)sVar5 >> 4,
                           (send_ts - uVar1 >> (decoderSampRate == kIsacSuperWideband)) +
                           bwest_str->prev_rec_send_ts,
                           (arr_ts - uVar2 >> (decoderSampRate == kIsacSuperWideband)) +
                           bwest_str->prev_rec_arr_ts,packet_size);
        sVar5 = 0;
        if (iVar3 < 0) {
          sVar5 = iVar3;
        }
        iVar4 = (int)sVar5;
      }
    }
  }
  return iVar4;
}

Assistant:

int
WebRtcIsac_EstimateBandwidth(
    BwEstimatorstr*           bwest_str,
    Bitstr*                   streamdata,
    size_t                packet_size,
    uint16_t              rtp_seq_number,
    uint32_t              send_ts,
    uint32_t              arr_ts,
    enum IsacSamplingRate encoderSampRate,
    enum IsacSamplingRate decoderSampRate)
{
  int16_t  index;
  int16_t  frame_samples;
  uint32_t sendTimestampIn16kHz;
  uint32_t arrivalTimestampIn16kHz;
  uint32_t diffSendTime;
  uint32_t diffArrivalTime;
  int err;

  /* decode framelength and BW estimation */
  err = WebRtcIsac_DecodeFrameLen(streamdata, &frame_samples);
  if(err < 0)  // error check
  {
    return err;
  }
  err = WebRtcIsac_DecodeSendBW(streamdata, &index);
  if(err < 0)  // error check
  {
    return err;
  }

  /* UPDATE ESTIMATES FROM OTHER SIDE */
  err = WebRtcIsac_UpdateUplinkBwImpl(bwest_str, index, encoderSampRate);
  if(err < 0)
  {
    return err;
  }

  // We like BWE to work at 16 kHz sampling rate,
  // therefore, we have to change the timestamps accordingly.
  // translate the send timestamp if required
  diffSendTime = (uint32_t)((uint32_t)send_ts -
                                  (uint32_t)bwest_str->senderTimestamp);
  bwest_str->senderTimestamp = send_ts;

  diffArrivalTime = (uint32_t)((uint32_t)arr_ts -
                                     (uint32_t)bwest_str->receiverTimestamp);
  bwest_str->receiverTimestamp = arr_ts;

  if(decoderSampRate == kIsacSuperWideband)
  {
    diffArrivalTime = (uint32_t)diffArrivalTime >> 1;
    diffSendTime = (uint32_t)diffSendTime >> 1;
  }

  // arrival timestamp in 16 kHz
  arrivalTimestampIn16kHz = (uint32_t)((uint32_t)
                                             bwest_str->prev_rec_arr_ts + (uint32_t)diffArrivalTime);
  // send timestamp in 16 kHz
  sendTimestampIn16kHz = (uint32_t)((uint32_t)
                                          bwest_str->prev_rec_send_ts + (uint32_t)diffSendTime);

  err = WebRtcIsac_UpdateBandwidthEstimator(bwest_str, rtp_seq_number,
                                            (frame_samples * 1000) / FS, sendTimestampIn16kHz,
                                            arrivalTimestampIn16kHz, packet_size);
  // error check
  if(err < 0)
  {
    return err;
  }

  return 0;
}